

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statement.cpp
# Opt level: O3

span<const_slang::ast::StatementBlockSymbol_*const,_18446744073709551615UL>
slang::ast::Statement::createAndAddBlockItems
          (Scope *scope,StatementSyntax *syntax,bool labelHandled)

{
  pointer ppSVar1;
  long lVar2;
  long lVar3;
  span<const_slang::ast::StatementBlockSymbol_*const,_18446744073709551615UL> sVar4;
  SmallVector<const_slang::syntax::SyntaxNode_*,_5UL> extraMembers;
  SmallVector<const_slang::syntax::SyntaxNode_*,_5UL> local_70;
  
  local_70.super_SmallVectorBase<const_slang::syntax::SyntaxNode_*>.data_ =
       (pointer)local_70.super_SmallVectorBase<const_slang::syntax::SyntaxNode_*>.firstElement;
  local_70.super_SmallVectorBase<const_slang::syntax::SyntaxNode_*>.len = 0;
  local_70.super_SmallVectorBase<const_slang::syntax::SyntaxNode_*>.cap = 5;
  sVar4 = createBlockItems(scope,syntax,labelHandled,&local_70);
  if (sVar4._M_extent._M_extent_value._M_extent_value != 0) {
    lVar2 = 0;
    do {
      Scope::insertMember(scope,*(Symbol **)((long)sVar4._M_ptr + lVar2),scope->lastMember,false,
                          true);
      lVar2 = lVar2 + 8;
    } while (sVar4._M_extent._M_extent_value._M_extent_value * 8 - lVar2 != 0);
  }
  ppSVar1 = local_70.super_SmallVectorBase<const_slang::syntax::SyntaxNode_*>.data_;
  if (local_70.super_SmallVectorBase<const_slang::syntax::SyntaxNode_*>.len != 0) {
    lVar2 = local_70.super_SmallVectorBase<const_slang::syntax::SyntaxNode_*>.len << 3;
    lVar3 = 0;
    do {
      Scope::addMembers(scope,*(SyntaxNode **)((long)ppSVar1 + lVar3));
      lVar3 = lVar3 + 8;
    } while (lVar2 != lVar3);
  }
  if (local_70.super_SmallVectorBase<const_slang::syntax::SyntaxNode_*>.data_ !=
      (pointer)local_70.super_SmallVectorBase<const_slang::syntax::SyntaxNode_*>.firstElement) {
    operator_delete(local_70.super_SmallVectorBase<const_slang::syntax::SyntaxNode_*>.data_);
  }
  return sVar4;
}

Assistant:

std::span<const StatementBlockSymbol* const> Statement::createAndAddBlockItems(
    Scope& scope, const StatementSyntax& syntax, bool labelHandled) {

    SmallVector<const SyntaxNode*> extraMembers;
    auto blocks = createBlockItems(scope, syntax, labelHandled, extraMembers);
    for (auto block : blocks)
        scope.addMember(*block);
    for (auto member : extraMembers)
        scope.addMembers(*member);

    return blocks;
}